

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

JavascriptFunction * __thiscall
Js::JavascriptStackWalker::UpdateFrame(JavascriptStackWalker *this,bool includeInlineFrames)

{
  InlinedFrameWalker *self;
  undefined8 uVar1;
  undefined8 uVar2;
  ushort uVar3;
  uint uVar4;
  InterpreterStackFrame *pIVar5;
  size_t sVar6;
  code *pcVar7;
  bool bVar8;
  int loopNum;
  JavascriptFunction *obj;
  CallInfo CVar9;
  JavascriptFunction *pJVar10;
  undefined4 *puVar11;
  void *pvVar12;
  ScriptFunction *pSVar13;
  JavascriptFunction *pJVar14;
  ushort uVar15;
  char *message;
  char *error;
  byte bVar16;
  uint uVar17;
  uint lineNumber;
  int iVar18;
  undefined1 auVar19 [16];
  
  bVar8 = CheckJavascriptFrame(this,includeInlineFrames);
  uVar4 = *(uint *)&this->field_0x50;
  *(ushort *)&this->field_0x50 = ((ushort)uVar4 & 0xfffb) + (ushort)bVar8 * 4;
  if (!bVar8 && (uVar4 & 1) == 0) {
    return (JavascriptFunction *)0x0;
  }
  obj = GetCurrentFunction(this,true);
  CVar9 = GetCallInfo(this,false);
  pIVar5 = this->interpreterFrame;
  iVar18 = CVar9._0_4_;
  if (pIVar5 == (InterpreterStackFrame *)0x0) {
    uVar3 = *(ushort *)&this->field_0x50;
    if ((uVar3 & 8) != 0) goto LAB_00aede49;
    pvVar12 = (this->lastInternalFrameInfo).codeAddress;
    uVar15 = uVar3 & 2;
    uVar4._0_1_ = (this->lastInternalFrameInfo).hasInlinedFramesOnStack;
    uVar4._1_1_ = (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout;
    uVar4._2_2_ = *(undefined2 *)&(this->lastInternalFrameInfo).field_0x2a;
    uVar17 = (uint)(uVar3 >> 1);
    if (pvVar12 != (void *)0x0) {
      uVar17 = uVar4;
    }
    if (((uVar17 & 1) != 0) && (-1 < iVar18 || !includeInlineFrames)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x25c,
                                  "(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody))"
                                  ,
                                  "!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody)"
                                 );
      if (!bVar8) goto LAB_00aede6d;
      *puVar11 = 0;
      pvVar12 = (this->lastInternalFrameInfo).codeAddress;
      uVar4._0_1_ = (this->lastInternalFrameInfo).hasInlinedFramesOnStack;
      uVar15 = *(ushort *)&this->field_0x50 & 2;
    }
    bVar16 = uVar15 != 0;
    if (pvVar12 != (void *)0x0) {
      bVar16 = (byte)uVar4;
    }
    if (((~includeInlineFrames | bVar16) & 1) != 0) goto LAB_00aede49;
    if (pvVar12 != (void *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x262,"(lastInternalFrameInfo.codeAddress == nullptr)",
                                  "lastInternalFrameInfo.codeAddress == nullptr");
      if (!bVar8) goto LAB_00aede6d;
      *puVar11 = 0;
    }
    pSVar13 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    bVar8 = InlinedFrameWalker::FromPhysicalFrame
                      (&this->inlinedFrameWalker,&this->currentFrame,pSVar13,false,-1,
                       (JavascriptStackWalker *)0x0,false,false);
    if (!bVar8) goto LAB_00aede49;
    bVar8 = InlinedFrameWalker::Next(&this->inlinedFrameWalker,&this->inlinedFrameCallInfo);
    *(ushort *)&this->field_0x50 =
         ((ushort)*(undefined4 *)&this->field_0x50 & 0xfffc) + (ushort)bVar8 + 2;
    if (bVar8) goto LAB_00aede49;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    error = "(inlinedFramesBeingWalked)";
    message = "inlinedFramesBeingWalked";
    lineNumber = 0x271;
  }
  else {
    if ((this->lastInternalFrameInfo).codeAddress != (void *)0x0) {
      this->field_0x50 = this->field_0x50 | 0x80;
    }
    if (((byte)pIVar5[0xd4] & 8) == 0) {
      pJVar10 = StackScriptFunction::GetCurrentFunctionObject
                          (*(JavascriptFunction **)(pIVar5 + 0x80));
      if (pJVar10 != obj) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x255,
                                    "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function)"
                                    ,
                                    "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function"
                                   );
        if (!bVar8) goto LAB_00aede6d;
        *puVar11 = 0;
      }
      this->field_0x50 = this->field_0x50 & 0xbf;
      goto LAB_00aede49;
    }
    uVar4 = *(uint *)&this->field_0x50;
    *(ushort *)&this->field_0x50 = (ushort)uVar4 | 0x40;
    if ((uVar4 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0x229,"(!inlinedFramesBeingWalked)","!inlinedFramesBeingWalked");
      if (!bVar8) goto LAB_00aede6d;
      *puVar11 = 0;
    }
    if (!includeInlineFrames) {
      if ((iVar18 < 0) && ((this->lastInternalFrameInfo).codeAddress == (void *)0x0)) {
        sVar6 = (this->currentFrame).stackCheckCodeHeight;
        uVar1 = (this->currentFrame).frame;
        uVar2 = (this->currentFrame).codeAddr;
        auVar19._8_4_ = (int)uVar1;
        auVar19._0_8_ = uVar2;
        auVar19._12_4_ = (int)((ulong)uVar1 >> 0x20);
        (this->lastInternalFrameInfo).codeAddress = (void *)uVar2;
        (this->lastInternalFrameInfo).framePointer = (void *)auVar19._8_8_;
        (this->lastInternalFrameInfo).stackCheckCodeHeight = sVar6;
        (this->lastInternalFrameInfo).frameType = InternalFrameType_LoopBody;
        (this->lastInternalFrameInfo).function = obj;
        (this->lastInternalFrameInfo).hasInlinedFramesOnStack = false;
        (this->lastInternalFrameInfo).previousInterpreterFrameIsFromBailout = true;
      }
      goto LAB_00aede49;
    }
    loopNum = -1;
    if (iVar18 < 0) {
      loopNum = *(int *)(this->tempInterpreterFrame + 0xcc);
    }
    self = &this->inlinedFrameWalker;
    pSVar13 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(obj);
    bVar8 = InlinedFrameWalker::FromPhysicalFrame
                      (self,&this->currentFrame,pSVar13,true,loopNum,this,false,false);
    if (bVar8) {
      bVar8 = InlinedFrameWalker::Next(self,&this->inlinedFrameCallInfo);
      *(ushort *)&this->field_0x50 =
           ((ushort)*(undefined4 *)&this->field_0x50 & 0xfffc) + (ushort)bVar8 + 2;
      if (!bVar8) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar11 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                    ,0x23d,"(inlinedFramesBeingWalked)","inlinedFramesBeingWalked");
        if (!bVar8) goto LAB_00aede6d;
        *puVar11 = 0;
      }
      pJVar10 = StackScriptFunction::GetCurrentFunctionObject
                          (*(JavascriptFunction **)(this->interpreterFrame + 0x80));
      pJVar14 = InlinedFrameWalker::GetFunctionObject(self);
      if (pJVar10 == pJVar14) goto LAB_00aede49;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      error = 
      "(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject())"
      ;
      message = 
      "StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject()"
      ;
      lineNumber = 0x23e;
    }
    else {
      if (-1 < iVar18) goto LAB_00aede49;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      error = "(!isCurrentPhysicalFrameForLoopBody)";
      message = "!isCurrentPhysicalFrameForLoopBody";
      lineNumber = 0x242;
    }
  }
  bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                              ,lineNumber,error,message);
  if (!bVar8) {
LAB_00aede6d:
    pcVar7 = (code *)invalidInstructionException();
    (*pcVar7)();
  }
  *puVar11 = 0;
LAB_00aede49:
  this->scriptContext =
       (((((obj->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  return obj;
}

Assistant:

Js::JavascriptFunction * JavascriptStackWalker::UpdateFrame(bool includeInlineFrames)
    {
        this->isJavascriptFrame = this->CheckJavascriptFrame(includeInlineFrames);

        if (this->IsJavascriptFrame())
        {
            // In case we have a cross site thunk, update the script context
            Js::JavascriptFunction *function = this->GetCurrentFunction();

#if ENABLE_NATIVE_CODEGEN
            bool isCurrentPhysicalFrameForLoopBody = this->IsCurrentPhysicalFrameForLoopBody();
#endif
            if (this->interpreterFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                if (lastInternalFrameInfo.codeAddress != nullptr)
                {
                    this->previousInterpreterFrameIsForLoopBody = true;
                }
#endif

                // We might've bailed out of an inlinee, so check if there were any inlinees.
                if (this->interpreterFrame->TestFlags(InterpreterStackFrameFlags_FromBailOut))
                {
                    previousInterpreterFrameIsFromBailout = true;

#if ENABLE_NATIVE_CODEGEN
                    Assert(!inlinedFramesBeingWalked);
                    if (includeInlineFrames)
                    {
                        int loopNum = -1;
                        if (isCurrentPhysicalFrameForLoopBody)
                        {
                            loopNum = this->tempInterpreterFrame->GetCurrentLoopNum();
                        }

                        bool hasInlinedFramesOnStack = InlinedFrameWalker::FromPhysicalFrame(inlinedFrameWalker, currentFrame,
                            VarTo<ScriptFunction>(function), true /*fromBailout*/, loopNum, this, false /*useInternalFrameInfo*/, false /*noAlloc*/);

                        if (hasInlinedFramesOnStack)
                        {
                            // We're now back in the state where currentFrame == physical frame of the inliner, but
                            // since interpreterFrame != null, we'll pick values from the interpreterFrame (the bailout
                            // frame of the inliner). Set a flag to tell the stack walker that it needs to start from the
                            // inlinee frames on the stack when Walk() is called.
                            this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                            this->hasInlinedFramesOnStack = hasInlinedFramesOnStack;
                            Assert(inlinedFramesBeingWalked);
                            Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == inlinedFrameWalker.GetFunctionObject());
                        }
                        else
                        {
                            Assert(!isCurrentPhysicalFrameForLoopBody);
                        }
                    }
                    else if (isCurrentPhysicalFrameForLoopBody)
                    {
                        // Getting here is only possible when the current interpreterFrame is for a function which
                        // encountered a bailout after getting inlined in a jitted loop body. If we are not including
                        // inlined frames in the stack walk, we need to set the codeAddress on lastInternalFrameInfo,
                        // which would have otherwise been set upon closing the inlinedFrameWalker, now.
                        // Note that we already have an assert in CheckJavascriptFrame to ensure this.
                        SetCachedInternalFrameInfo(InternalFrameType_LoopBody, function, false /*hasInlinedFramesOnStack*/, true /*previousInterpreterFrameIsFromBailout*/);
                    }
#else
                    // How did we bail out when JIT was disabled?
                    Assert(false);
#endif
                }
                else
                {
                    Assert(StackScriptFunction::GetCurrentFunctionObject(this->interpreterFrame->GetJavascriptFunction()) == function);
                    previousInterpreterFrameIsFromBailout = false;
                }
            }
            else if (!this->isNativeLibraryFrame)
            {
#if ENABLE_NATIVE_CODEGEN
                Assert(!HasInlinedFramesOnStack() || (includeInlineFrames && isCurrentPhysicalFrameForLoopBody));

                if (!HasInlinedFramesOnStack() && includeInlineFrames)
                {
                    // Check whether there are inlined frames nested in this native frame. The corresponding check for
                    // a jitted loop body frame should have been done in CheckJavascriptFrame
                    Assert(lastInternalFrameInfo.codeAddress == nullptr);
                    bool inlinedFramesFound = InlinedFrameWalker::FromPhysicalFrame(
                        inlinedFrameWalker,
                        currentFrame,
                        VarTo<ScriptFunction>(function),
                        false,  // fromBailout
                        -1,     // loopNum
                        nullptr,// walker
                        false,  // useInternalFrameInfo
                        false   // noAlloc
                    );
                    if (inlinedFramesFound)
                    {
                        this->inlinedFramesBeingWalked = inlinedFrameWalker.Next(inlinedFrameCallInfo);
                        this->hasInlinedFramesOnStack = true;
                        Assert(inlinedFramesBeingWalked);
                    }
                }
#endif
            }
            this->scriptContext = function->GetScriptContext();
            return function;
        }
        return nullptr;
    }